

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_string_substr(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  JSValueUnion p;
  uint uVar2;
  uint max;
  JSValue v;
  JSValue JVar3;
  JSValue JVar4;
  int n;
  int a;
  int local_44;
  JSValueUnion local_40;
  int local_34;
  
  JVar3 = JS_ToStringCheckObject(ctx,this_val);
  p = JVar3.u;
  uVar2 = (uint)JVar3.tag;
  if (uVar2 != 6) {
    max = *(uint *)((long)p.ptr + 4) & 0x7fffffff;
    local_40 = p;
    iVar1 = JS_ToInt32Clamp(ctx,&local_34,*argv,0,max,max);
    if (iVar1 == 0) {
      local_44 = max - local_34;
      if (((int)argv[1].tag == 3) ||
         (JVar4.tag = argv[1].tag, JVar4.u.ptr = argv[1].u.ptr,
         iVar1 = JS_ToInt32Clamp(ctx,&local_44,JVar4,0,local_44,0), iVar1 == 0)) {
        JVar4 = js_sub_string(ctx,(JSString *)p.ptr,local_34,local_44 + local_34);
        if (uVar2 < 0xfffffff5) {
          return JVar4;
        }
        iVar1 = *local_40.ptr;
        *(int *)local_40.ptr = iVar1 + -1;
        if (1 < iVar1) {
          return JVar4;
        }
        v.tag = JVar3.tag;
        v.u.ptr = local_40.ptr;
        __JS_FreeValueRT(ctx->rt,v);
        return JVar4;
      }
    }
    if ((0xfffffff4 < uVar2) &&
       (iVar1 = *local_40.ptr, *(int *)local_40.ptr = iVar1 + -1, iVar1 < 2)) {
      JVar3.u.ptr = local_40.ptr;
      __JS_FreeValueRT(ctx->rt,JVar3);
    }
    JVar3 = (JSValue)(ZEXT816(6) << 0x40);
  }
  return JVar3;
}

Assistant:

static JSValue js_string_substr(JSContext *ctx, JSValueConst this_val,
                                int argc, JSValueConst *argv)
{
    JSValue str, ret;
    int a, len, n;
    JSString *p;

    str = JS_ToStringCheckObject(ctx, this_val);
    if (JS_IsException(str))
        return str;
    p = JS_VALUE_GET_STRING(str);
    len = p->len;
    if (JS_ToInt32Clamp(ctx, &a, argv[0], 0, len, len)) {
        JS_FreeValue(ctx, str);
        return JS_EXCEPTION;
    }
    n = len - a;
    if (!JS_IsUndefined(argv[1])) {
        if (JS_ToInt32Clamp(ctx, &n, argv[1], 0, len - a, 0)) {
            JS_FreeValue(ctx, str);
            return JS_EXCEPTION;
        }
    }
    ret = js_sub_string(ctx, p, a, a + n);
    JS_FreeValue(ctx, str);
    return ret;
}